

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int exprCodeInlineFunction(Parse *pParse,ExprList *pFarg,int iFuncId,int target)

{
  uint uVar1;
  Vdbe *p;
  byte bVar2;
  int iVar3;
  Op *pOVar4;
  int op;
  long lVar5;
  char *zP4;
  Expr caseExpr;
  Expr local_78;
  
  if (5 < (uint)iFuncId) {
    iVar3 = sqlite3ExprCodeTarget(pParse,pFarg->a[0].pExpr,target);
    return iVar3;
  }
  p = pParse->pVdbe;
  switch(iFuncId) {
  case 0:
    uVar1 = pFarg->nExpr;
    iVar3 = pParse->nLabel + -1;
    pParse->nLabel = iVar3;
    sqlite3ExprCode(pParse,pFarg->a[0].pExpr,target);
    if (1 < (int)uVar1) {
      lVar5 = 0;
      do {
        sqlite3VdbeAddOp3(p,0x33,target,iVar3,0);
        sqlite3ExprCode(pParse,*(Expr **)((long)pFarg[1].a + lVar5 + -8),target);
        lVar5 = lVar5 + 0x18;
      } while ((ulong)uVar1 * 0x18 + -0x18 != lVar5);
    }
    if (p->db->mallocFailed == '\0') {
      pOVar4 = p->aOp + (long)p->nOp + -1;
    }
    else {
      pOVar4 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    if ((pOVar4->opcode == 'P') && (0 < (long)p->nOp)) {
      p->aOp[(long)p->nOp + -1].p5 = 1;
    }
    sqlite3VdbeResolveLabel(p,iVar3);
    break;
  case 1:
    if (**(char **)(pFarg + 1) == -0x59) {
      iVar3 = sqlite3ExprImpliesNonNullRow(pFarg->a[0].pExpr,*(int *)(*(char **)(pFarg + 1) + 0x2c))
      ;
      goto LAB_00186b7a;
    }
    op = 0x4b;
    iVar3 = 0;
    goto LAB_00186b84;
  case 2:
    iVar3 = sqlite3ExprImpliesExpr(pParse,pFarg->a[0].pExpr,*(Expr **)(pFarg + 1),-1);
    goto LAB_00186b7a;
  case 3:
    iVar3 = sqlite3ExprCompare((Parse *)0x0,pFarg->a[0].pExpr,*(Expr **)(pFarg + 1),-1);
LAB_00186b7a:
    op = 0x47;
LAB_00186b84:
    sqlite3VdbeAddOp3(p,op,iVar3,target,0);
    break;
  case 4:
    bVar2 = sqlite3ExprAffinity(pFarg->a[0].pExpr);
    if ((char)bVar2 < 'A') {
      zP4 = "none";
    }
    else {
      zP4 = &DAT_001e4748 + *(int *)(&DAT_001e4748 + (ulong)(bVar2 - 0x41) * 4);
    }
    iVar3 = sqlite3VdbeAddOp3(p,0x75,0,target,0);
    sqlite3VdbeChangeP4(p,iVar3,zP4,0);
    break;
  case 5:
    local_78.u.zToken = (char *)0x0;
    local_78.nHeight = 0;
    local_78.iTable = 0;
    local_78.iColumn = 0;
    local_78.iAgg = 0;
    local_78.w = (anon_union_4_2_009eaf8f_for_w)0x0;
    local_78.pAggInfo = (AggInfo *)0x0;
    local_78.pLeft = (Expr *)0x0;
    local_78.pRight = (Expr *)0x0;
    local_78.y.pTab = (Table *)0x0;
    local_78.op = 0x9d;
    local_78.affExpr = '\0';
    local_78.op2 = '\0';
    local_78._3_1_ = 0;
    local_78.flags = 0;
    local_78.x.pList = pFarg;
    target = sqlite3ExprCodeTarget(pParse,&local_78,target);
  }
  return target;
}

Assistant:

static int exprCodeInlineFunction(
  Parse *pParse,        /* Parsing context */
  ExprList *pFarg,      /* List of function arguments */
  int iFuncId,          /* Function ID.  One of the INTFUNC_... values */
  int target            /* Store function result in this register */
){
  int nFarg;
  Vdbe *v = pParse->pVdbe;
  assert( v!=0 );
  assert( pFarg!=0 );
  nFarg = pFarg->nExpr;
  assert( nFarg>0 );  /* All in-line functions have at least one argument */
  switch( iFuncId ){
    case INLINEFUNC_coalesce: {
      /* Attempt a direct implementation of the built-in COALESCE() and
      ** IFNULL() functions.  This avoids unnecessary evaluation of
      ** arguments past the first non-NULL argument.
      */
      int endCoalesce = sqlite3VdbeMakeLabel(pParse);
      int i;
      assert( nFarg>=2 );
      sqlite3ExprCode(pParse, pFarg->a[0].pExpr, target);
      for(i=1; i<nFarg; i++){
        sqlite3VdbeAddOp2(v, OP_NotNull, target, endCoalesce);
        VdbeCoverage(v);
        sqlite3ExprCode(pParse, pFarg->a[i].pExpr, target);
      }
      setDoNotMergeFlagOnCopy(v);
      sqlite3VdbeResolveLabel(v, endCoalesce);
      break;
    }
    case INLINEFUNC_iif: {
      Expr caseExpr;
      memset(&caseExpr, 0, sizeof(caseExpr));
      caseExpr.op = TK_CASE;
      caseExpr.x.pList = pFarg;
      return sqlite3ExprCodeTarget(pParse, &caseExpr, target);
    }
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
    case INLINEFUNC_sqlite_offset: {
      Expr *pArg = pFarg->a[0].pExpr;
      if( pArg->op==TK_COLUMN && pArg->iTable>=0 ){
        sqlite3VdbeAddOp3(v, OP_Offset, pArg->iTable, pArg->iColumn, target);
      }else{
        sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      }
      break;
    }
#endif
    default: {
      /* The UNLIKELY() function is a no-op.  The result is the value
      ** of the first argument.
      */
      assert( nFarg==1 || nFarg==2 );
      target = sqlite3ExprCodeTarget(pParse, pFarg->a[0].pExpr, target);
      break;
    }

  /***********************************************************************
  ** Test-only SQL functions that are only usable if enabled
  ** via SQLITE_TESTCTRL_INTERNAL_FUNCTIONS
  */
#if !defined(SQLITE_UNTESTABLE)
    case INLINEFUNC_expr_compare: {
      /* Compare two expressions using sqlite3ExprCompare() */
      assert( nFarg==2 );
      sqlite3VdbeAddOp2(v, OP_Integer,
         sqlite3ExprCompare(0,pFarg->a[0].pExpr, pFarg->a[1].pExpr,-1),
         target);
      break;
    }

    case INLINEFUNC_expr_implies_expr: {
      /* Compare two expressions using sqlite3ExprImpliesExpr() */
      assert( nFarg==2 );
      sqlite3VdbeAddOp2(v, OP_Integer,
         sqlite3ExprImpliesExpr(pParse,pFarg->a[0].pExpr, pFarg->a[1].pExpr,-1),
         target);
      break;
    }

    case INLINEFUNC_implies_nonnull_row: {
      /* REsult of sqlite3ExprImpliesNonNullRow() */
      Expr *pA1;
      assert( nFarg==2 );
      pA1 = pFarg->a[1].pExpr;
      if( pA1->op==TK_COLUMN ){
        sqlite3VdbeAddOp2(v, OP_Integer,
           sqlite3ExprImpliesNonNullRow(pFarg->a[0].pExpr,pA1->iTable),
           target);
      }else{
        sqlite3VdbeAddOp2(v, OP_Null, 0, target);
      }
      break;
    }

    case INLINEFUNC_affinity: {
      /* The AFFINITY() function evaluates to a string that describes
      ** the type affinity of the argument.  This is used for testing of
      ** the SQLite type logic.
      */
      const char *azAff[] = { "blob", "text", "numeric", "integer", "real" };
      char aff;
      assert( nFarg==1 );
      aff = sqlite3ExprAffinity(pFarg->a[0].pExpr);
      sqlite3VdbeLoadString(v, target,
              (aff<=SQLITE_AFF_NONE) ? "none" : azAff[aff-SQLITE_AFF_BLOB]);
      break;
    }
#endif /* !defined(SQLITE_UNTESTABLE) */
  }
  return target;
}